

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT<double>(TPZMultiphysicsElement *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  TPZCompMesh *pTVar10;
  TPZCompEl *this_00;
  long lVar11;
  long lVar12;
  TPZFMatrix<double> *pTVar13;
  TPZFMatrix<double> *pTVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long local_90;
  int local_48;
  
  uVar9 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x270))();
  pTVar10 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  if (0 < (int)uVar9) {
    uVar4 = ((pTVar10->fSolution).fBaseMatrix)->fCol;
    uVar17 = 0;
    iVar15 = 0;
    do {
      this_00 = (TPZCompEl *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x268))(this,uVar17);
      if (this_00 != (TPZCompEl *)0x0) {
        cVar7 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x2f8))(this,uVar17 & 0xffffffff);
        if (cVar7 != '\0') {
          iVar8 = (**(code **)(*(long *)this_00 + 0x90))();
          if (0 < iVar8) {
            iVar18 = 0;
            do {
              lVar11 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))(this,iVar15);
              lVar12 = (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar18);
              iVar2 = *(int *)(lVar11 + 8);
              iVar3 = *(int *)(lVar12 + 8);
              pTVar10 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              lVar11 = (long)(pTVar10->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].
                             dim;
              pTVar10 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              iVar2 = (pTVar10->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].pos;
              pTVar10 = TPZCompEl::Mesh(this_00);
              iVar3 = (pTVar10->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar3].pos;
              pTVar10 = TPZCompEl::Mesh(this_00);
              pTVar13 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar10->fSolution);
              pTVar10 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              pTVar14 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar10->fSolution);
              if (0 < lVar11) {
                local_90 = 0;
                do {
                  local_48 = (int)uVar4;
                  if (0 < local_48) {
                    lVar12 = local_90 + iVar2;
                    lVar1 = local_90 + iVar3;
                    uVar16 = 0;
                    do {
                      if (((lVar12 < 0) ||
                          (lVar5 = (pTVar14->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                          lVar5 <= lVar12)) ||
                         ((pTVar14->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
                          (long)uVar16)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (((lVar1 < 0) ||
                          (lVar6 = (pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                          lVar6 <= lVar1)) ||
                         ((pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
                          (long)uVar16)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      pTVar13->fElem[lVar6 * uVar16 + lVar1] =
                           pTVar14->fElem[lVar5 * uVar16 + lVar12];
                      uVar16 = uVar16 + 1;
                    } while ((uVar4 & 0x7fffffff) != uVar16);
                  }
                  local_90 = local_90 + 1;
                } while (local_90 != lVar11);
              }
              iVar18 = iVar18 + 1;
              iVar15 = iVar15 + 1;
            } while (iVar18 != iVar8);
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uVar9 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT()
{
    int nmeshes = this->NMeshes();
    int icon = 0;
    int nload = this->Mesh()->Solution().Cols();
    for (int imesh = 0; imesh < nmeshes; imesh++) {
        TPZCompEl *cel = this->ReferredElement(imesh);
        if (!cel) {
            continue;
        }
        if(!this->IsActiveApproxSpaces(imesh)){
            continue;
        }
        int ncon = cel->NConnects();
        for (int iconloc = 0; iconloc < ncon; iconloc++, icon++) {
            TPZConnect &con = this->Connect(icon);
            TPZConnect &conloc = cel->Connect(iconloc);
            int64_t seq = con.SequenceNumber();
            int64_t seqloc = conloc.SequenceNumber();
            int blsz = this->Mesh()->Block().Size(seq);

#ifdef PZDEBUG
            int blszloc = cel->Mesh()->Block().Size(seqloc);
            if (blsz != blszloc) {
                DebugStop();
            }
#endif
            int pos = this->Mesh()->Block().Position(seq);
            int posloc = cel->Mesh()->Block().Position(seqloc);
            TPZFMatrix<TVar> &celSol = cel->Mesh()->Solution();
            TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();
            for (int ibl = 0; ibl < blsz; ibl++) {
                for (int iload = 0; iload < nload; iload++) {
                    celSol(posloc+ibl,iload) = meshSol(pos+ibl,iload);
                }

            }
        }
    }
}